

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall SmallArray<ExprBase_*,_128U>::~SmallArray(SmallArray<ExprBase_*,_128U> *this)

{
  SmallArray<ExprBase_*,_128U> *this_local;
  
  if (this->data != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      NULLC::destruct<ExprBase*>(this->data,(ulong)this->max);
    }
    else {
      Allocator::destruct<ExprBase*>(this->allocator,this->data,(ulong)this->max);
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}